

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O3

void slang::ast::anon_unknown_39::unwrapResult
               (Scope *scope,optional<slang::SourceRange> range,LookupResult *result,
               bool unwrapGenericClasses)

{
  byte bVar1;
  SymbolKind SVar2;
  Scope *pSVar3;
  DeclaredType *pDVar4;
  GenericClassDefSymbol *pGVar5;
  Diagnostic *pDVar6;
  Symbol *pSVar7;
  Symbol *pSVar8;
  LookupResult *pLVar9;
  DiagCode code;
  GenericClassDefSymbol *this;
  
  if (result->found == (Symbol *)0x0) {
    return;
  }
  if (((((result->flags).m_bits & 2) != 0) &&
      (pDVar4 = Symbol::getDeclaredType(result->found), pDVar4 != (DeclaredType *)0x0)) &&
     ((pDVar4->field_0x3f & 0x40) != 0)) {
    if (range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_engaged == true) {
      pDVar6 = Diagnostics::add(&result->diagnostics,scope->thisSym,(DiagCode)0x29000a,
                                range.super__Optional_base<slang::SourceRange,_true,_true>.
                                _M_payload.super__Optional_payload_base<slang::SourceRange>.
                                _M_payload._M_value);
      Diagnostic::operator<<(pDVar6,result->found->name);
      Diagnostic::addNote(pDVar6,(DiagCode)0x50001,result->found->location);
    }
    result->found = (Symbol *)0x0;
    return;
  }
  checkVisibility(result->found,scope,range,result);
  this = (GenericClassDefSymbol *)result->found;
  SVar2 = (this->super_Symbol).kind;
  if (SVar2 == TypeAlias) {
    Compilation::noteReference(scope->compilation,(Symbol *)this,false);
    this = (GenericClassDefSymbol *)result->found;
  }
  else if (SVar2 == TypeParameter) {
    Compilation::noteReference(scope->compilation,(Symbol *)this,false);
    this = (GenericClassDefSymbol *)result->found[2].parentScope;
    result->found = (Symbol *)this;
    (result->flags).m_bits = (result->flags).m_bits | 8;
  }
  pGVar5 = this;
  if (unwrapGenericClasses && (this->super_Symbol).kind == GenericClassDef) {
    pGVar5 = (GenericClassDefSymbol *)GenericClassDefSymbol::getDefaultSpecialization(this,scope);
    result->found = (Symbol *)pGVar5;
    if (pGVar5 == (GenericClassDefSymbol *)0x0) {
      if (range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_engaged != true) {
        return;
      }
      pDVar6 = Diagnostics::add(&result->diagnostics,scope->thisSym,(DiagCode)0x1b000a,
                                range.super__Optional_base<slang::SourceRange,_true,_true>.
                                _M_payload.super__Optional_payload_base<slang::SourceRange>.
                                _M_payload._M_value);
      Diagnostic::operator<<(pDVar6,(this->super_Symbol).name);
      return;
    }
  }
  if (range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged != true) {
    return;
  }
  bVar1 = (result->flags).m_bits;
  if ((bVar1 & 1) == 0) {
    if ((bVar1 & 2) != 0) {
      pSVar8 = scope->thisSym;
      while( true ) {
        if (pSVar8->kind == InstanceBody) {
          return;
        }
        pLVar9 = result;
        if (pSVar8->kind == Package) break;
        if (pSVar8->parentScope == (Scope *)0x0) {
          return;
        }
        pSVar8 = pSVar8->parentScope->thisSym;
      }
      do {
        pSVar7 = pLVar9->found;
        if (pSVar7->kind == InstanceBody) break;
        if (pSVar7->kind == Package) goto LAB_00325f7a;
        pLVar9 = (LookupResult *)&pSVar7->parentScope->thisSym;
      } while (pSVar7->parentScope != (Scope *)0x0);
      pSVar7 = (Symbol *)0x0;
LAB_00325f7a:
      if (pSVar7 == pSVar8) {
        return;
      }
      Diagnostics::add(&result->diagnostics,scope->thisSym,(DiagCode)0xb000a,
                       range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                       super__Optional_payload_base<slang::SourceRange>._M_payload._M_value);
      return;
    }
    pSVar3 = (pGVar5->super_Symbol).parentScope;
    if (pSVar3 == (Scope *)0x0) {
      return;
    }
    if (pSVar3->thisSym->kind != CompilationUnit) {
      return;
    }
    pSVar8 = scope->thisSym;
    pSVar7 = pSVar8;
    while( true ) {
      if (pSVar7->kind == InstanceBody) {
        return;
      }
      if (pSVar7->kind == Package) break;
      if (pSVar7->parentScope == (Scope *)0x0) {
        return;
      }
      pSVar7 = pSVar7->parentScope->thisSym;
    }
    code.subsystem = Lookup;
    code.code = 4;
  }
  else {
    do {
      pSVar3 = (pGVar5->super_Symbol).parentScope;
      if (pSVar3 == (Scope *)0x0) {
        return;
      }
      pGVar5 = (GenericClassDefSymbol *)pSVar3->thisSym;
      SVar2 = (pGVar5->super_Symbol).kind;
      if (SVar2 == Package) {
        return;
      }
    } while (SVar2 != AnonymousProgram);
    pSVar8 = scope->thisSym;
    for (pSVar7 = pSVar8; pSVar7->kind != InstanceBody; pSVar7 = pSVar7->parentScope->thisSym) {
      if (pSVar7->kind == AnonymousProgram) {
        return;
      }
      if (pSVar7->parentScope == (Scope *)0x0) goto LAB_00325fb9;
    }
    if (*(int *)(pSVar7[2].name._M_str + 0x48) == 2) {
      return;
    }
LAB_00325fb9:
    code.subsystem = Lookup;
    code.code = 0xf;
  }
  pDVar6 = Diagnostics::add(&result->diagnostics,pSVar8,code,
                            range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                            super__Optional_payload_base<slang::SourceRange>._M_payload._M_value);
  Diagnostic::addNote(pDVar6,(DiagCode)0x50001,result->found->location);
  return;
}

Assistant:

void unwrapResult(const Scope& scope, std::optional<SourceRange> range, LookupResult& result,
                  bool unwrapGenericClasses = true) {
    if (!result.found)
        return;

    if (result.flags.has(LookupResultFlags::IsHierarchical)) {
        auto declaredType = result.found->getDeclaredType();
        if (declaredType && declaredType->isEvaluating()) {
            if (range) {
                auto& diag = result.addDiag(scope, diag::RecursiveDefinition, *range);
                diag << result.found->name;
                diag.addNote(diag::NoteDeclarationHere, result.found->location);
            }
            result.found = nullptr;
            return;
        }
    }

    checkVisibility(*result.found, scope, range, result);

    // Unwrap type parameters into their target type alias.
    if (result.found->kind == SymbolKind::TypeParameter) {
        scope.getCompilation().noteReference(*result.found);

        result.found = &result.found->as<TypeParameterSymbol>().getTypeAlias();
        result.flags |= LookupResultFlags::FromTypeParam;
    }
    else if (result.found->kind == SymbolKind::TypeAlias) {
        scope.getCompilation().noteReference(*result.found);
    }

    // If the found symbol is a generic class, unwrap into
    // the default specialization (if possible).
    if (result.found->kind == SymbolKind::GenericClassDef && unwrapGenericClasses) {
        auto& genericClass = result.found->as<GenericClassDefSymbol>();
        result.found = genericClass.getDefaultSpecialization(scope);

        if (!result.found) {
            if (range)
                result.addDiag(scope, diag::NoDefaultSpecialization, *range) << genericClass.name;
            return;
        }
    }

    if (!range)
        return;

    if (result.flags.has(LookupResultFlags::WasImported)) {
        // If the symbol was imported from a package, check if it is actually
        // declared within an anonymous program within that package and if so,
        // check whether we're allowed to reference it from our source scope.
        auto parent = result.found->getParentScope();
        while (parent) {
            auto& parentSym = parent->asSymbol();
            if (parentSym.kind == SymbolKind::Package)
                break;

            if (parentSym.kind == SymbolKind::AnonymousProgram) {
                if (!isInProgram(scope.asSymbol())) {
                    auto& diag = result.addDiag(scope, diag::IllegalReferenceToProgramItem, *range);
                    diag.addNote(diag::NoteDeclarationHere, result.found->location);
                }
                break;
            }

            parent = parentSym.getParentScope();
        }
    }
    else if (result.flags.has(LookupResultFlags::IsHierarchical)) {
        // Hierarchical references are not allowed from within packages
        // unless the target symbol is also within the same package.
        auto pkg = getContainingPackage(scope.asSymbol());
        if (pkg && getContainingPackage(*result.found) != pkg)
            result.addDiag(scope, diag::HierarchicalFromPackage, *range);
    }
    else if (auto parent = result.found->getParentScope();
             parent && parent->asSymbol().kind == SymbolKind::CompilationUnit) {
        // Compilation unit items are not allowed to be referenced from a package.
        if (getContainingPackage(scope.asSymbol())) {
            auto& diag = result.addDiag(scope, diag::CompilationUnitFromPackage, *range);
            diag.addNote(diag::NoteDeclarationHere, result.found->location);
        }
    }
}